

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipAnalysis.cpp
# Opt level: O2

void __thiscall HighsMipAnalysis::reportMipTimer(HighsMipAnalysis *this)

{
  HighsTimerClock *mip_timer_clock;
  MipTimer mip_timer;
  string local_60;
  string local_40;
  
  if (this->analyse_mip_time == true) {
    mip_timer_clock = &this->mip_clocks;
    MipTimer::reportMipCoreClock(&mip_timer,mip_timer_clock);
    MipTimer::reportMipLevel1Clock(&mip_timer,mip_timer_clock);
    MipTimer::reportMipEvaluateRootNodeClock(&mip_timer,mip_timer_clock);
    MipTimer::reportMipSolveLpClock(&mip_timer,mip_timer_clock);
    std::__cxx11::string::string((string *)&local_40,(string *)&this->model_name);
    MipTimer::csvEvaluateRootNodeClock(&mip_timer,&local_40,mip_timer_clock,true,true);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::string((string *)&local_60,(string *)&this->model_name);
    MipTimer::csvEvaluateRootNodeClock(&mip_timer,&local_60,mip_timer_clock,false,true);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void HighsMipAnalysis::reportMipTimer() {
  if (!analyse_mip_time) return;
  MipTimer mip_timer;
  mip_timer.reportMipCoreClock(mip_clocks);
  mip_timer.reportMipLevel1Clock(mip_clocks);
  mip_timer.reportMipEvaluateRootNodeClock(mip_clocks);
  //  mip_timer.reportAltEvaluateRootNodeClock(mip_clocks);
  //  mip_timer.reportMipPresolveClock(mip_clocks);
  //  mip_timer.reportMipSeparationClock(mip_clocks);
  //  mip_timer.reportMipSearchClock(mip_clocks);
  //  mip_timer.reportMipDiveClock(mip_clocks);
  //  mip_timer.reportMipNodeSearchClock(mip_clocks);
  //  mip_timer.reportMipDivePrimalHeuristicsClock(mip_clocks);
  //  mip_timer.reportMipSubMipSolveClock(mip_clocks);
  mip_timer.reportMipSolveLpClock(mip_clocks);
  //  mip_timer.csvMipClock(this->model_name, mip_clocks, true, false);
  //  reportMipSolveLpClock(true);
  //  mip_timer.csvMipClock(this->model_name, mip_clocks, false, false);
  //  reportMipSolveLpClock(false);
  mip_timer.csvEvaluateRootNodeClock(this->model_name, mip_clocks, true, true);
  mip_timer.csvEvaluateRootNodeClock(this->model_name, mip_clocks, false, true);
  //  analyseVectorValues(nullptr, "Node search time",
  //                      HighsInt(node_search_time.size()), node_search_time);
  //  analyseVectorValues(nullptr, "Dive time", HighsInt(dive_time.size()),
  //                      dive_time);
}